

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureType::MergeFrom(ArrayFeatureType *this,ArrayFeatureType *from)

{
  int iVar1;
  uint32 uVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  ArrayFeatureType_EnumeratedShapes *pAVar5;
  ArrayFeatureType_ShapeRange *pAVar6;
  ArrayFeatureType_EnumeratedShapes *from_00;
  ArrayFeatureType_ShapeRange *from_01;
  int32 iVar7;
  DefaultOptionalValueUnion DVar8;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/FeatureTypes.pb.cc"
               ,0xca2);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b2);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->shape_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve
              (&this->shape_,iVar1 + (this->shape_).current_size_);
    memcpy(((this->shape_).rep_)->elements + (this->shape_).current_size_,
           ((from->shape_).rep_)->elements,(long)(from->shape_).current_size_ << 3);
    (this->shape_).current_size_ = (this->shape_).current_size_ + (from->shape_).current_size_;
  }
  if (from->datatype_ != 0) {
    this->datatype_ = from->datatype_;
  }
  if (from->_oneof_case_[0] == 0x1f) {
    if (this->_oneof_case_[0] != 0x1f) {
      clear_ShapeFlexibility(this);
      this->_oneof_case_[0] = 0x1f;
      pAVar6 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
      ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar6);
      (this->ShapeFlexibility_).shaperange_ = pAVar6;
    }
    pAVar6 = (this->ShapeFlexibility_).shaperange_;
    if (from->_oneof_case_[0] == 0x1f) {
      from_01 = (from->ShapeFlexibility_).shaperange_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (ArrayFeatureType_ShapeRange *)&_ArrayFeatureType_ShapeRange_default_instance_;
    }
    ArrayFeatureType_ShapeRange::MergeFrom(pAVar6,from_01);
  }
  else if (from->_oneof_case_[0] == 0x15) {
    if (this->_oneof_case_[0] != 0x15) {
      clear_ShapeFlexibility(this);
      this->_oneof_case_[0] = 0x15;
      pAVar5 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
      ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(pAVar5);
      (this->ShapeFlexibility_).enumeratedshapes_ = pAVar5;
    }
    pAVar5 = (this->ShapeFlexibility_).enumeratedshapes_;
    if (from->_oneof_case_[0] == 0x15) {
      from_00 = (from->ShapeFlexibility_).enumeratedshapes_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_00 = (ArrayFeatureType_EnumeratedShapes *)
                &_ArrayFeatureType_EnumeratedShapes_default_instance_;
    }
    ArrayFeatureType_EnumeratedShapes::MergeFrom(pAVar5,from_00);
  }
  uVar2 = from->_oneof_case_[1];
  if (uVar2 == 0x3d) {
    if (uVar2 == 0x3d) {
      DVar8 = from->defaultOptionalValue_;
    }
    else {
      DVar8.doubledefaultvalue_ = 0.0;
    }
    if (this->_oneof_case_[1] != 0x3d) {
      this->_oneof_case_[1] = 0x3d;
    }
    (this->defaultOptionalValue_).doubledefaultvalue_ = (double)DVar8;
  }
  else if (uVar2 == 0x33) {
    if (uVar2 == 0x33) {
      iVar7 = (from->defaultOptionalValue_).intdefaultvalue_;
    }
    else {
      iVar7 = 0;
    }
    if (this->_oneof_case_[1] != 0x33) {
      this->_oneof_case_[1] = 0x33;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar7;
  }
  else if (uVar2 == 0x29) {
    iVar7 = (from->defaultOptionalValue_).intdefaultvalue_;
    if (this->_oneof_case_[1] != 0x29) {
      this->_oneof_case_[1] = 0x29;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar7;
  }
  return;
}

Assistant:

void ArrayFeatureType::MergeFrom(const ArrayFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from.datatype() != 0) {
    set_datatype(from.datatype());
  }
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from.enumeratedshapes());
      break;
    }
    case kShapeRange: {
      mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from.shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      set_intdefaultvalue(from.intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      set_floatdefaultvalue(from.floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      set_doubledefaultvalue(from.doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
}